

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O0

bool __thiscall cmTest::GetPropertyAsBool(cmTest *this,string *prop)

{
  bool bVar1;
  cmValue val;
  string *prop_local;
  cmTest *this_local;
  
  val = GetProperty(this,prop);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmTest::GetPropertyAsBool(const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}